

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaRex.c
# Opt level: O2

void Gia_ManPrintReached(char *pStr,int iState,Vec_Int_t *vReached)

{
  int iVar1;
  int i;
  
  printf("Reached from state %d \'%c\':  ",(long)iState,(ulong)(uint)(int)pStr[iState]);
  for (i = 0; i < vReached->nSize; i = i + 1) {
    iVar1 = Vec_IntEntry(vReached,i);
    printf("%d \'%c\'  ",(long)iVar1,(ulong)(uint)(int)pStr[iVar1]);
  }
  putchar(10);
  return;
}

Assistant:

void Gia_ManPrintReached( char * pStr, int iState, Vec_Int_t * vReached )
{
    int i, Entry;
    printf( "Reached from state %d \'%c\':  ", iState, pStr[iState] );
    Vec_IntForEachEntry( vReached, Entry, i )
        printf( "%d \'%c\'  ", Entry, pStr[Entry] );
    printf( "\n" );
}